

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O1

double __thiscall Net::derivative_function(Net *this,double x)

{
  FUNCTIONS FVar1;
  double dVar2;
  double dVar3;
  
  FVar1 = this->function_type;
  if (FVar1 == RELU) {
    dVar2 = (double)(-(ulong)(0.0 < x) & 0x3ff0000000000000);
  }
  else if (FVar1 == TANH) {
    dVar2 = tanh(x);
    dVar3 = tanh(x);
    dVar2 = 1.0 - dVar3 * dVar2;
  }
  else {
    dVar2 = 0.0;
    if (FVar1 == SIGMOID) {
      dVar3 = exp(-x);
      dVar2 = 0.0;
      if ((dVar3 + 1.0 != 0.0) || (NAN(dVar3 + 1.0))) {
        dVar2 = exp(-x);
        dVar2 = 1.0 / (dVar2 + 1.0);
      }
      dVar2 = (1.0 - dVar2) * dVar2;
    }
  }
  return dVar2;
}

Assistant:

double Net::derivative_function(double x){
    switch (function_type) {
        case SIGMOID:
            return sigmoid_derivative(x);
        case TANH:
            return hyp_tan_derivative(x);
        case RELU:
            return ReLU_derivative(x);
    }
    return 0;
}